

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

bool __thiscall Polymer::CheckReadthroughPolCollisions(Polymer *this,Ptr *pol)

{
  element_type *peVar1;
  bool bVar2;
  Ptr next_pol;
  undefined1 local_20 [16];
  
  MobileElementManager::GetPol((MobileElementManager *)local_20,(int)this + 0x90);
  peVar1 = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1->stop_ < this->stop_) ||
     (bVar2 = true, peVar1->footprint_ < *(int *)(local_20._0_8_ + 0x38))) {
    bVar2 = false;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_);
  }
  return bVar2;
}

Assistant:

bool Polymer::CheckReadthroughPolCollisions(MobileElement::Ptr pol) {
  auto next_pol = polymerases_.GetPol(0);
  if (pol->stop() >= stop_) {
    if (next_pol->start() <= pol->footprint()) {
      return true;
    }
  } 
  return false;
}